

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_callback_cancel_nolock_(event_base *base,event_callback *evcb,int even_if_finalizing)

{
  byte *pbVar1;
  byte bVar2;
  uint8_t uVar3;
  unsigned_long uVar4;
  code *pcVar5;
  eventop *peVar6;
  long lVar7;
  event_change *peVar8;
  short sVar9;
  int iVar10;
  int extraout_EAX;
  _func_unsigned_long *p_Var11;
  unsigned_long uVar12;
  ulong uVar13;
  _func_void_int_short_void_ptr *p_Var14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  char *pcVar18;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  char *pcVar19;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar20;
  long lVar21;
  ulong uVar22;
  event_base *unaff_RBX;
  ulong *puVar23;
  undefined1 *puVar24;
  ushort uVar25;
  ulong unaff_RBP;
  long lVar26;
  long lVar27;
  char *pcVar28;
  _func_void_int_short_void_ptr *unaff_R12;
  timeval *ptVar29;
  long unaff_R13;
  int iVar30;
  event_base *unaff_R14;
  event_base *unaff_R15;
  bool bVar31;
  undefined1 auStack_8 [8];
  
  puVar24 = auStack_8;
  uVar25 = evcb->evcb_flags;
  if ((even_if_finalizing == 0 & (byte)((uVar25 & 0x40) >> 6)) != 0) {
    RSb[0xcb] = 'Y';
    ram0x0025e5bf = 0xfd3e50ff;
    return 0;
  }
  if ((char)uVar25 < '\0') {
    if ((char)uVar25 < '\0') {
      iVar10 = event_del_nolock_((event *)evcb,3 - (uint)(even_if_finalizing == 0));
      return iVar10;
    }
    event_callback_cancel_nolock__cold_1();
switchD_00232383_caseD_5:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xc0d,"0","event_callback_cancel_nolock_");
  }
  uVar15 = uVar25 >> 3 & 5;
  p_Var11 = (_func_unsigned_long *)(ulong)uVar15;
  uVar16 = (&switchD_00232383::switchdataD_0025e5a8)[(long)p_Var11];
  bVar31 = (event_callback *)((long)&switchD_00232383::switchdataD_0025e5a8 + (long)(int)uVar16) ==
           (event_callback *)0x0;
  switch(uVar15) {
  case 0:
    goto switchD_00232383_caseD_0;
  case 1:
    event_queue_remove_active(base,evcb);
    break;
  default:
    puVar24 = &stack0xffffffffffffffe0;
    p_Var11 = (_func_unsigned_long *)(ulong)(ushort)evcb->evcb_flags;
    unaff_RBX = (event_base *)0x0;
    unaff_R14 = base;
    unaff_R15 = (event_base *)evcb;
    if ((evcb->evcb_flags & 0x40U) != 0) goto switchD_0023240e_caseD_1;
    goto code_r0x002323fa;
  case 4:
    event_queue_remove_active_later(base,evcb);
    break;
  case 5:
    goto switchD_00232383_caseD_5;
  case 6:
    evcb = (event_callback *)((ulong)base & 0xffffffff);
    puVar24 = auStack_8;
code_r0x002323fa:
    puVar17 = &switchD_0023240e::switchdataD_0025e5c0;
    switch((uint)((ulong)p_Var11 >> 3) & 5) {
    case 0:
      unaff_RBX = (event_base *)0x1;
      break;
    case 1:
      goto switchD_0023240e_caseD_1;
    default:
      *(event_base **)(puVar24 + -8) = unaff_R15;
      *(event_base **)(puVar24 + -0x10) = unaff_R14;
      *(event_base **)(puVar24 + -0x18) = unaff_RBX;
      pvVar20 = base->th_base_lock;
      if (pvVar20 != (void *)0x0) {
        *(undefined8 *)(puVar24 + -0x20) = 0x232587;
        (*evthread_lock_fns_.lock)(0,pvVar20);
      }
      *(undefined8 *)(puVar24 + -0x20) = 0x232595;
      event_callback_finalize_nolock_
                (base,(uint)pvVar20,
                 (event_callback *)
                 ((long)&switchD_00232383::switchdataD_0025e5a8 + (long)(int)uVar16),
                 (_func_void_event_callback_ptr_void_ptr *)&switchD_0023240e::switchdataD_0025e5c0);
      if (base->th_base_lock != (void *)0x0) {
        iVar10 = (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        return iVar10;
      }
      return extraout_EAX;
    case 4:
      *(undefined8 *)(puVar24 + -8) = 0x232422;
      event_queue_remove_active_later(unaff_R14,(event_callback *)unaff_R15);
      unaff_RBX = (event_base *)0x0;
      break;
    case 5:
      goto switchD_0023240e_caseD_5;
    case 6:
      unique0x00006b00 = 0xfd3e5100;
      puVar23 = (ulong *)(puVar24 + -8);
      puVar24 = puVar24 + -8;
      *puVar23 = unaff_RBP;
      RSb[0xcb] = '@';
code_r0x00233f96:
      pbVar1 = (byte *)((long)puVar17 * 5 + -0x19);
      *pbVar1 = *pbVar1 & (byte)puVar17;
      *(undefined8 *)(puVar24 + -8) = 0x233f9c;
      (*(code *)unaff_RBX)(base,evcb);
LAB_0023416a:
      if (unaff_R15->th_base_lock != (void *)0x0) {
        pcVar5 = *(code **)(unaff_R13 + 0x18);
        *(undefined8 *)(puVar24 + -8) = 0x23417c;
        (*pcVar5)(0);
      }
      unaff_R15->current_event = (event_callback *)0x0;
      if (unaff_R15->current_event_waiters != 0) {
        unaff_R15->current_event_waiters = 0;
        pvVar20 = unaff_R15->current_event_cond;
        if (pvVar20 != (void *)0x0) {
          *(undefined8 *)(puVar24 + -8) = 0x2341b7;
          (*evthread_cond_fns_.signal_condition)(pvVar20,1);
        }
      }
      iVar10 = 1;
      iVar30 = (int)unaff_R14;
      if (unaff_R15->event_break == 0) {
        if (iVar30 < *(int *)(puVar24 + 0x34)) {
          if ((*(long *)(puVar24 + 0x38) != 0) && (iVar30 != 0)) {
            (unaff_R15->tv_cache).tv_sec = 0;
            if ((unaff_R15->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
              *(undefined8 *)(puVar24 + -8) = 0x234209;
              gettime(unaff_R15,*(timeval **)(puVar24 + 0x40));
            }
            *(undefined8 *)(puVar24 + -8) = 0x234216;
            gettime(unaff_R15,(timeval *)(puVar24 + 8));
            lVar26 = **(long **)(puVar24 + 0x38);
            if (*(long *)(puVar24 + 8) == lVar26) {
              if ((*(long **)(puVar24 + 0x38))[1] <= *(long *)(puVar24 + 0x10)) goto LAB_00234233;
LAB_00234245:
              bVar31 = true;
            }
            else {
              if (*(long *)(puVar24 + 8) < lVar26) goto LAB_00234245;
LAB_00234233:
              bVar31 = false;
              *(int *)(puVar24 + 0x1c) = iVar30;
            }
            if (!bVar31) goto LAB_0023425b;
          }
          iVar10 = (uint)(unaff_R15->event_continue != 0) << 2;
        }
        else {
          *(int *)(puVar24 + 0x1c) = iVar30;
        }
      }
      else {
        *(undefined4 *)(puVar24 + 0x1c) = 0xffffffff;
      }
LAB_0023425b:
      if (iVar10 != 0) {
        if (iVar10 == 4) {
          return iVar30;
        }
        return *(int *)(puVar24 + 0x1c);
      }
      base = (event_base *)**(undefined8 **)(puVar24 + 0x50);
      if (base == (event_base *)0x0) {
        return iVar30;
      }
      uVar25 = *(ushort *)&(base->changelist).changes;
      if ((char)uVar25 < '\0') {
        if ((uVar25 & 0x40) == 0 &&
            (*(ushort *)((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&base->sig + 4) & 0x10) == 0
           ) {
          *(undefined8 *)(puVar24 + -8) = 0x233db6;
          event_del_nolock_((event *)base,0);
          pvVar20 = extraout_RDX_02;
        }
        else {
          *(undefined8 *)(puVar24 + -8) = 0x233daa;
          event_queue_remove_active(unaff_R15,(event_callback *)base);
          pvVar20 = extraout_RDX_01;
        }
        unaff_RBX = base;
        if (event_debug_logging_mask_ != 0) {
          uVar25 = *(short *)((long)&base->sig + 0x42);
          pcVar19 = "EV_READ ";
          if ((uVar25 & 2) == 0) {
            pcVar19 = " ";
          }
          pcVar18 = "EV_WRITE ";
          if ((uVar25 & 4) == 0) {
            pcVar18 = " ";
          }
          pcVar28 = "EV_CLOSED ";
          if (-1 < (char)uVar25) {
            pcVar28 = " ";
          }
          p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
                    evcb_callback;
          *(undefined8 *)(puVar24 + -8) = 0x233e0f;
          event_debugx_("event_process_active: event: %p, %s%s%scall %p",base,pcVar19,pcVar18,
                        pcVar28,p_Var14);
          pvVar20 = extraout_RDX_03;
        }
      }
      else {
        *(undefined8 *)(puVar24 + -8) = 0x233d5f;
        event_queue_remove_active(unaff_R15,(event_callback *)base);
        pvVar20 = extraout_RDX;
        if (event_debug_logging_mask_ != 0) {
          bVar2 = *(uint8_t *)((long)&(base->changelist).changes + 3);
          p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
                    evcb_callback;
          *(undefined8 *)(puVar24 + -8) = 0x233d87;
          event_debugx_("event_process_active: event_callback %p, closure %d, call %p",base,
                        (ulong)bVar2,p_Var14);
          pvVar20 = extraout_RDX_00;
        }
        unaff_RBX = (event_base *)0x0;
      }
      unaff_R14 = (event_base *)
                  (ulong)(iVar30 + (uint)(((ulong)(base->changelist).changes & 0x10) == 0));
      unaff_R15->current_event = (event_callback *)base;
      unaff_R15->current_event_waiters = 0;
      uVar3 = *(uint8_t *)((long)&(base->changelist).changes + 3);
      puVar17 = &switchD_00233e53::switchdataD_0025e5d8;
      switch(uVar3) {
      case '\0':
        if (unaff_RBX != (event_base *)0x0) {
          unaff_R12 = ((anon_union_8_4_85009615_for_evcb_cb_union *)
                      &(unaff_RBX->changelist).n_changes)->evcb_callback;
          uVar25 = *(short *)((long)&unaff_RBX->sig + 0x42);
          unaff_RBP = (ulong)uVar25;
          if (unaff_R15->th_base_lock != (void *)0x0) {
switchD_0023240e_caseD_7:
            uVar25 = (ushort)unaff_RBP;
            pcVar5 = *(code **)(unaff_R13 + 0x20);
            *(undefined8 *)(puVar24 + -8) = 0x233fc4;
            (*pcVar5)(0);
          }
          iVar10 = ((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[1].min_heap_idx;
          peVar6 = unaff_RBX->evsigsel;
          *(undefined8 *)(puVar24 + -8) = 0x233fd1;
          (*unaff_R12)(iVar10,uVar25,peVar6);
          goto LAB_0023416a;
        }
        break;
      case '\x01':
        if (unaff_RBX != (event_base *)0x0) {
          sVar9 = *(short *)((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig + 3);
          *(short *)(puVar24 + 8) = sVar9;
          if (sVar9 != 0) {
            *(undefined1 **)((long)&unaff_RBX->sig + 0x38) = puVar24 + 8;
          }
          if (unaff_R15->th_base_lock != (void *)0x0) {
            pcVar5 = *(code **)(unaff_R13 + 0x20);
            *(undefined8 *)(puVar24 + -8) = 0x234008;
            (*pcVar5)();
          }
          do {
            if (*(short *)(puVar24 + 8) == 0) goto LAB_0023416a;
            sVar9 = *(short *)(puVar24 + 8) + -1;
            *(short *)(puVar24 + 8) = sVar9;
            *(short *)((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig + 3) = sVar9;
            if (sVar9 == 0) {
              *(undefined8 *)((long)&unaff_RBX->sig + 0x38) = 0;
            }
            iVar10 = ((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[1].
                     min_heap_idx;
            sVar9 = *(short *)((long)&unaff_RBX->sig + 0x42);
            peVar6 = unaff_RBX->evsigsel;
            p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)
                      &(unaff_RBX->changelist).n_changes)->evcb_callback;
            *(undefined8 *)(puVar24 + -8) = 0x23403a;
            (*p_Var14)(iVar10,sVar9,peVar6);
            if (unaff_R15->th_base_lock != (void *)0x0) {
              pcVar5 = *(code **)(unaff_R13 + 0x18);
              *(undefined8 *)(puVar24 + -8) = 0x23404c;
              (*pcVar5)();
            }
            iVar10 = unaff_R15->event_break;
            if (unaff_R15->th_base_lock != (void *)0x0) {
              pcVar5 = *(code **)(unaff_R13 + 0x20);
              *(undefined8 *)(puVar24 + -8) = 0x234065;
              (*pcVar5)();
            }
          } while (iVar10 == 0);
          if (*(short *)(puVar24 + 8) != 0) {
            *(undefined8 *)((long)&unaff_RBX->sig + 0x38) = 0;
          }
          goto LAB_0023416a;
        }
LAB_00234295:
        *(undefined8 *)(puVar24 + -8) = 0x23429a;
        event_process_active_single_queue_cold_7();
        break;
      case '\x02':
        if (unaff_RBX == (event_base *)0x0) goto LAB_002342a4;
        if ((*(long *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[3].
                       ev_next_with_common_timeout != 0) ||
           (*(long *)((long)&unaff_RBX->sig + 0x38) != 0)) {
          if ((*(ulong *)((long)&unaff_RBX->sig + 0x38) ^
              *(ulong *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[5].
                         ev_next_with_common_timeout) < 0x100000) {
            ptVar29 = (timeval *)((long)&unaff_RBX->sig + 0x48);
            *(undefined8 *)(puVar24 + -8) = 0x233f22;
            gettime(unaff_R15,(timeval *)(puVar24 + 0x20));
            uVar22 = *(ulong *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[5].
                                ev_next_with_common_timeout;
            if ((((uint)uVar22 & 0xf0000000) == 0x50000000) &&
               ((int)((uint)(uVar22 >> 0x14) & 0xff) < unaff_R15->n_common_timeouts)) {
              lVar26 = *(long *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[3]
                                 .ev_next_with_common_timeout;
              uVar15 = (uint)*(undefined8 *)((long)&unaff_RBX->sig + 0x38);
              uVar16 = uVar15 & 0xfff00000;
              uVar13 = (ulong)(uVar15 & 0xfffff);
              if ((*(byte *)((long)&unaff_RBX->sig + 0x42) & 1) == 0) {
                uVar22 = *(ulong *)(puVar24 + 0x28);
                ptVar29 = (timeval *)(puVar24 + 0x20);
              }
              else {
                uVar22 = (ulong)((uint)uVar22 & 0xfffff);
              }
            }
            else {
              bVar31 = (*(byte *)((long)&unaff_RBX->sig + 0x42) & 1) == 0;
              lVar26 = *(long *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[3]
                                 .ev_next_with_common_timeout;
              if (bVar31) {
                uVar22 = *(ulong *)(puVar24 + 0x28);
              }
              uVar13 = *(ulong *)((long)&unaff_RBX->sig + 0x38);
              if (bVar31) {
                ptVar29 = (timeval *)(puVar24 + 0x20);
              }
              uVar16 = 0;
            }
            lVar27 = ptVar29->tv_sec + lVar26;
            *(long *)(puVar24 + 8) = lVar27;
            lVar21 = uVar22 + uVar13;
            *(long *)(puVar24 + 0x10) = lVar21;
            if (999999 < lVar21) {
              *(long *)(puVar24 + 8) = lVar27 + 1;
              *(long *)(puVar24 + 0x10) = lVar21 + -1000000;
            }
            lVar21 = *(long *)(puVar24 + 0x20);
            lVar27 = *(long *)(puVar24 + 8);
            bVar31 = SBORROW8(lVar27,lVar21);
            lVar7 = lVar27 - lVar21;
            if (lVar27 == lVar21) {
              bVar31 = SBORROW8(*(long *)(puVar24 + 0x10),*(long *)(puVar24 + 0x28));
              lVar7 = *(long *)(puVar24 + 0x10) - *(long *)(puVar24 + 0x28);
            }
            if (bVar31 != lVar7 < 0) {
              *(long *)(puVar24 + 8) = lVar21 + lVar26;
              lVar27 = uVar13 + *(long *)(puVar24 + 0x28);
              *(long *)(puVar24 + 0x10) = lVar27;
              if (999999 < lVar27) {
                *(long *)(puVar24 + 8) = lVar21 + lVar26 + 1;
                *(long *)(puVar24 + 0x10) = lVar27 + -1000000;
              }
            }
            *(ulong *)(puVar24 + 0x10) = *(ulong *)(puVar24 + 0x10) | (ulong)uVar16;
            *(undefined8 *)(puVar24 + -8) = 0x23412e;
            event_add_nolock_((event *)unaff_RBX,(timeval *)(puVar24 + 8),1);
            goto LAB_0023412e;
          }
          goto LAB_002342a9;
        }
LAB_0023412e:
        p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(unaff_RBX->changelist).n_changes)
                  ->evcb_callback;
        peVar6 = unaff_RBX->evsigsel;
        iVar10 = ((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&unaff_RBX->sig)[1].min_heap_idx;
        sVar9 = *(short *)((long)&unaff_RBX->sig + 0x42);
        if (unaff_R15->th_base_lock != (void *)0x0) {
          *(_func_void_int_short_void_ptr **)(puVar24 + 0x48) = p_Var14;
          pcVar5 = *(code **)(unaff_R13 + 0x20);
          *(undefined8 *)(puVar24 + -8) = 0x234154;
          (*pcVar5)(0);
          p_Var14 = *(_func_void_int_short_void_ptr **)(puVar24 + 0x48);
        }
        *(undefined8 *)(puVar24 + -8) = 0x234163;
        (*p_Var14)(iVar10,sVar9,peVar6);
        goto LAB_0023416a;
      case '\x03':
        goto switchD_00233e53_caseD_3;
      case '\x04':
        unaff_RBX = (event_base *)
                    ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
                    evcb_callback;
        unaff_R15->current_event = (event_callback *)0x0;
        if (((ulong)(base->changelist).changes & 0x40) == 0) goto LAB_0023429f;
        goto LAB_00233f80;
      case '\x05':
      case '\x06':
        if (unaff_RBX == (event_base *)0x0) {
          *(undefined8 *)(puVar24 + -8) = 0x234290;
          event_process_active_single_queue_cold_3();
LAB_00234290:
          *(undefined8 *)(puVar24 + -8) = 0x234295;
          event_process_active_single_queue_cold_2();
          goto LAB_00234295;
        }
        unaff_R15->current_event = (event_callback *)0x0;
        if (((ulong)(base->changelist).changes & 0x40) == 0) goto LAB_00234290;
        p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(unaff_RBX->changelist).n_changes)
                  ->evcb_callback;
        if (unaff_R15->th_base_lock != (void *)0x0) {
          pcVar5 = *(code **)(unaff_R13 + 0x20);
          *(undefined8 *)(puVar24 + -8) = 0x233e8b;
          (*pcVar5)(0);
          pvVar20 = extraout_RDX_04;
        }
        peVar6 = unaff_RBX->evsigsel;
        *(undefined8 *)(puVar24 + -8) = 0x233e95;
        (*p_Var14)((int)unaff_RBX,(short)peVar6,pvVar20);
        *(undefined8 *)(puVar24 + -8) = 0x233e9d;
        event_debug_note_teardown_((event *)unaff_RBX);
        if (uVar3 == '\x06') {
          if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
            *(undefined8 *)(puVar24 + -8) = 0x23416a;
            free(unaff_RBX);
          }
          else {
            *(undefined8 *)(puVar24 + -8) = 0x233ebc;
            (*mm_free_fn_)(unaff_RBX);
          }
        }
        goto LAB_0023416a;
      default:
        goto switchD_00233e53_default;
      }
      *(undefined8 *)(puVar24 + -8) = 0x23429f;
      event_process_active_single_queue_cold_4();
LAB_0023429f:
      *(undefined8 *)(puVar24 + -8) = 0x2342a4;
      event_process_active_single_queue_cold_1();
LAB_002342a4:
      *(undefined8 *)(puVar24 + -8) = 0x2342a9;
      event_process_active_single_queue_cold_6();
LAB_002342a9:
      *(undefined8 *)(puVar24 + -8) = 0x2342ae;
      event_process_active_single_queue_cold_5();
      *(undefined8 *)(puVar24 + -8) = 0x2342b3;
      event_process_active_single_queue_cold_8();
switchD_00233e53_default:
      *(code **)(puVar24 + -8) = evthread_notify_base_eventfd;
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0x6c2,"0","event_process_active_single_queue");
    case 7:
      goto switchD_0023240e_caseD_7;
    }
    pvVar20 = unaff_R14->th_base_lock;
    if ((pvVar20 != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
      *(undefined8 *)(puVar24 + -8) = 0x232441;
      iVar10 = evthread_is_debug_lock_held_(pvVar20);
      if (iVar10 != 0) goto LAB_00232449;
      *(undefined8 *)(puVar24 + -8) = 0x23252f;
      event_callback_activate_nolock__cold_2();
LAB_0023252f:
      *(undefined8 *)(puVar24 + -8) = 0x232534;
      event_callback_activate_nolock__cold_1();
switchD_0023240e_caseD_5:
      *(code **)(puVar24 + -8) = event_callback_finalize_;
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0xbcb,"0","event_callback_activate_nolock_");
    }
LAB_00232449:
    peVar8 = (unaff_R15->changelist).changes;
    if (((ulong)peVar8 & 8) == 0) {
      iVar10 = unaff_R14->event_count + (uint)(((ulong)peVar8 & 0x10) == 0);
      unaff_R14->event_count = iVar10;
      if (iVar10 < unaff_R14->event_count_max) {
        iVar10 = unaff_R14->event_count_max;
      }
      unaff_R14->event_count_max = iVar10;
      *(byte *)&(unaff_R15->changelist).changes = *(byte *)&(unaff_R15->changelist).changes | 8;
      iVar10 = unaff_R14->event_count_active + 1;
      unaff_R14->event_count_active = iVar10;
      if (iVar10 < unaff_R14->event_count_active_max) {
        iVar10 = unaff_R14->event_count_active_max;
      }
      unaff_R14->event_count_active_max = iVar10;
      bVar2 = *(byte *)((long)&(unaff_R15->changelist).changes + 2);
      if (unaff_R14->nactivequeues <= (int)(uint)bVar2) goto LAB_0023252f;
      unaff_R15->evsel = (eventop *)0x0;
      unaff_R15->evbase = unaff_R14->activequeues[bVar2].tqh_last;
      *unaff_R14->activequeues[bVar2].tqh_last = (event_callback *)unaff_R15;
      unaff_R14->activequeues[*(byte *)((long)&(unaff_R15->changelist).changes + 2)].tqh_last =
           (event_callback **)unaff_R15;
    }
    if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
      bVar31 = unaff_R14->running_loop == 0;
      p_Var11 = evthread_id_fn_;
switchD_00232383_caseD_7:
      if (!bVar31) {
        uVar4 = unaff_R14->th_owner_id;
        *(undefined8 *)(puVar24 + -8) = 0x232515;
        uVar12 = (*p_Var11)();
        if (uVar4 != uVar12) {
          *(undefined8 *)(puVar24 + -8) = 0x232522;
          evthread_notify_base(unaff_R14);
        }
      }
    }
switchD_0023240e_caseD_1:
    return (int)unaff_RBX;
  case 7:
    goto switchD_00232383_caseD_7;
  }
  uVar15 = 0;
switchD_00232383_caseD_0:
  return uVar15;
switchD_00233e53_caseD_3:
  unaff_RBX = (event_base *)
              ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
              evcb_callback;
LAB_00233f80:
  if (unaff_R15->th_base_lock != (void *)0x0) {
    pcVar5 = *(code **)(unaff_R13 + 0x20);
    *(undefined8 *)(puVar24 + -8) = 0x233f92;
    (*pcVar5)(0);
  }
  evcb = (event_callback *)base->evsigsel;
  goto code_r0x00233f96;
}

Assistant:

int
event_callback_cancel_nolock_(struct event_base *base,
    struct event_callback *evcb, int even_if_finalizing)
{
	if ((evcb->evcb_flags & EVLIST_FINALIZING) && !even_if_finalizing)
		return 0;

	if (evcb->evcb_flags & EVLIST_INIT)
		return event_del_nolock_(event_callback_to_event(evcb),
		    even_if_finalizing ? EVENT_DEL_EVEN_IF_FINALIZING : EVENT_DEL_AUTOBLOCK);

	switch ((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		event_queue_remove_active(base, evcb);
		return 0;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		break;
	case 0:
		break;
	}

	return 0;
}